

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *pNode)

{
  uint uVar1;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pAVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  ulong uVar7;
  long lVar8;
  int iVar9;
  long lVar6;
  
  lVar8 = 0;
  do {
    if ((pNode->vFanouts).nSize <= lVar8) {
      return 0;
    }
    pObj = (Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]];
    pAVar2 = pObj->pNtk;
    uVar1 = pObj->Id;
    uVar3 = (pAVar2->vTravIds).nSize;
    if ((int)uVar1 < (int)uVar3) {
      uVar7 = (ulong)uVar3;
    }
    else {
      uVar7 = (long)(int)uVar1 + 1;
      iVar4 = (pAVar2->vTravIds).nCap;
      iVar9 = (int)uVar7;
      if (((iVar4 * 2 <= (int)uVar1) || (iVar9 = iVar4 * 2, iVar4 <= (int)uVar1)) && (iVar4 < iVar9)
         ) {
        piVar5 = (pAVar2->vTravIds).pArray;
        if (piVar5 == (int *)0x0) {
          piVar5 = (int *)malloc((long)iVar9 << 2);
        }
        else {
          piVar5 = (int *)realloc(piVar5,(long)iVar9 << 2);
        }
        (pAVar2->vTravIds).pArray = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pAVar2->vTravIds).nCap = iVar9;
        uVar3 = (pAVar2->vTravIds).nSize;
      }
      for (lVar6 = (long)(int)uVar3; lVar6 < (long)uVar7; lVar6 = lVar6 + 1) {
        (pAVar2->vTravIds).pArray[lVar6] = 0;
      }
      (pAVar2->vTravIds).nSize = (int)uVar7;
    }
    if (((int)uVar1 < 0) || ((int)uVar7 <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    if ((pAVar2->vTravIds).pArray[uVar1] == pObj->pNtk->nTravIds) {
      iVar4 = Vec_IntFind(&pObj->vFanins,pNode->Id);
      if (iVar4 < 0) {
        __assert_fail("iFanin >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcAig.c"
                      ,0x4ec,"int Abc_AigNodeHasComplFanoutEdgeTrav(Abc_Obj_t *)");
      }
      iVar4 = Abc_ObjFaninC(pObj,iVar4);
      if (iVar4 != 0) {
        return 1;
      }
    }
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

int Abc_AigNodeHasComplFanoutEdgeTrav( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pFanout;
    int i, iFanin;
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            continue;
        iFanin = Vec_IntFind( &pFanout->vFanins, pNode->Id );
        assert( iFanin >= 0 );
        if ( Abc_ObjFaninC( pFanout, iFanin ) )
            return 1;
    }
    return 0;
}